

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByCamelcaseName(FileDescriptor *this,string *key)

{
  void *pvVar1;
  second_type pFVar2;
  FieldDescriptor *pFVar3;
  first_type local_30;
  
  pvVar1 = *(void **)(this + 0x90);
  local_30.first = pvVar1;
  std::
  call_once<void(&)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            ((once_flag *)((long)pvVar1 + 0xc0),
             FileDescriptorTables::FieldsByCamelcaseNamesLazyInitStatic,
             (FileDescriptorTables **)&local_30);
  local_30.second = (key->_M_dataplus)._M_p;
  local_30.first = this;
  pFVar2 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                     ((unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)((long)pvVar1 + 0x80),&local_30);
  if (pFVar2 == (second_type)0x0) {
    pFVar3 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar3 = (FieldDescriptor *)0x0;
    if (pFVar2[0x42] != (FieldDescriptor)0x0) {
      pFVar3 = pFVar2;
    }
  }
  return pFVar3;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByCamelcaseName(
    const std::string& key) const {
  const FieldDescriptor* result = tables_->FindFieldByCamelcaseName(this, key);
  if (result == nullptr || !result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}